

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  pointer pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 local_68 [8];
  string dot_extension;
  long local_38;
  
  dot_extension.field_2._8_8_ = &stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&dot_extension.field_2 + 8),".","");
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&dot_extension.field_2 + 8),extension);
  local_68 = (undefined1  [8])(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if (local_68 == (undefined1  [8])paVar4) {
    dot_extension._M_string_length = paVar4->_M_allocated_capacity;
    dot_extension.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar3->field_2 + 8);
    local_68 = (undefined1  [8])&dot_extension._M_string_length;
  }
  else {
    dot_extension._M_string_length = paVar4->_M_allocated_capacity;
  }
  dot_extension._M_dataplus._M_p = (pointer)pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((long *)dot_extension.field_2._8_8_ != &stack0xffffffffffffffc8) {
    operator_delete((void *)dot_extension.field_2._8_8_,local_38 + 1);
  }
  bVar2 = String::EndsWithCaseInsensitive(&this->pathname_,(string *)local_68);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&dot_extension.field_2 + 8),&this->pathname_,0,
               (this->pathname_)._M_string_length - (long)dot_extension._M_dataplus._M_p);
    FilePath(__return_storage_ptr__,(string *)((long)&dot_extension.field_2 + 8));
    if ((long *)dot_extension.field_2._8_8_ != &stack0xffffffffffffffc8) {
      operator_delete((void *)dot_extension.field_2._8_8_,local_38 + 1);
    }
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (this->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->pathname_)._M_string_length);
  }
  if (local_68 != (undefined1  [8])&dot_extension._M_string_length) {
    operator_delete((void *)local_68,dot_extension._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}